

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.cpp
# Opt level: O0

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  uint b;
  uint g;
  uint r;
  Vec3fa color;
  RayStats *in_stack_000001e8;
  ISPCCamera *in_stack_000001f0;
  float in_stack_000001f8;
  float in_stack_000001fc;
  TutorialData *in_stack_00000200;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_b8;
  float local_b4;
  float local_b0;
  
  renderPixel(in_stack_00000200,in_stack_000001fc,in_stack_000001f8,in_stack_000001f0,
              in_stack_000001e8);
  local_e0 = 1.0;
  if (local_b8 < 1.0) {
    local_e0 = local_b8;
  }
  local_e4 = 0.0;
  if (0.0 <= local_e0) {
    local_e4 = local_e0;
  }
  local_e8 = 1.0;
  if (local_b4 < 1.0) {
    local_e8 = local_b4;
  }
  local_ec = 0.0;
  if (0.0 <= local_e8) {
    local_ec = local_e8;
  }
  local_f0 = 1.0;
  if (local_b0 < 1.0) {
    local_f0 = local_b0;
  }
  local_f4 = 0.0;
  if (0.0 <= local_f0) {
    local_f4 = local_f0;
  }
  *(int *)(in_RCX + (ulong)(uint)(in_EDX * in_R8D + in_ESI) * 4) =
       (int)(long)(local_f4 * 255.0) * 0x10000 + (int)(long)(local_ec * 255.0) * 0x100 +
       (int)(long)(local_e4 * 255.0);
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* calculate pixel color */
  Vec3fa color = renderPixel(data, (float)x,(float)y,camera, stats);
  
  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}